

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

bool __thiscall Moc::testFunctionRevision(Moc *this,FunctionDef *def)

{
  long lVar1;
  QTypeRevision QVar2;
  bool bVar3;
  
  lVar1 = (this->super_Parser).index;
  if ((lVar1 < (this->super_Parser).symbols.d.size) &&
     ((this->super_Parser).symbols.d.ptr[lVar1].token == Q_REVISION_TOKEN)) {
    (this->super_Parser).index = lVar1 + 1;
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  if (bVar3 != false) {
    QVar2 = parseRevision(this);
    def->revision = (uint)(ushort)QVar2;
  }
  return bVar3;
}

Assistant:

bool Moc::testFunctionRevision(FunctionDef *def)
{

    if (test(Q_REVISION_TOKEN)) {
        def->revision = parseRevision().toEncodedVersion<int>();
        return true;
    }

    return false;
}